

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesFrequencyGetRange(zes_freq_handle_t hFrequency,zes_freq_range_t *pLimits)

{
  zes_pfnFrequencyGetRange_t pfnGetRange;
  ze_result_t result;
  zes_freq_range_t *pLimits_local;
  zes_freq_handle_t hFrequency_local;
  
  pfnGetRange._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cc20 != (code *)0x0) {
    pfnGetRange._4_4_ = (*DAT_0011cc20)(hFrequency,pLimits);
  }
  return pfnGetRange._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFrequencyGetRange(
        zes_freq_handle_t hFrequency,                   ///< [in] Handle for the component.
        zes_freq_range_t* pLimits                       ///< [in,out] The range between which the hardware can operate for the
                                                        ///< specified domain.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetRange = context.zesDdiTable.Frequency.pfnGetRange;
        if( nullptr != pfnGetRange )
        {
            result = pfnGetRange( hFrequency, pLimits );
        }
        else
        {
            // generic implementation
        }

        return result;
    }